

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

Am_Wrapper * get_button_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object widget;
  Am_Value value;
  
  pAVar2 = (Am_Wrapper *)&widget;
  Am_Object::Get_Owner(&widget,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&widget);
  if (bVar1) {
    value.type = 0;
    value.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&widget,0x169,1);
    Am_Value::operator=(&value,in_value);
    bVar1 = Am_Value::Valid(&value);
    if (bVar1) {
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&widget);
    }
    Am_Value::~Am_Value(&value);
    if (bVar1) goto LAB_00263a87;
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
LAB_00263a87:
  Am_Object::~Am_Object(&widget);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_button_widget_value)
{
  Am_Object widget = self.Get_Owner(); // widget the interactor is in
  if (widget.Valid()) {
    Am_Value value;
    value = widget.Peek(Am_VALUE);
    if (value.Valid())
      return widget;
  }
  return Am_No_Object;
}